

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Spatializer.cpp
# Opt level: O2

int Spatializer::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0xc0);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"AudioSrc Attn","",0.0,1.0,1.0,1.0,1.0,0,
                    "AudioSource distance attenuation");
  RegisterParameter(definition,"Fixed Volume","",0.0,1.0,0.0,1.0,1.0,1,"Fixed volume amount");
  RegisterParameter(definition,"Custom Falloff","",0.0,1.0,0.0,1.0,1.0,2,
                    "Custom volume falloff amount (logarithmic)");
  *(byte *)&definition->flags = (byte)definition->flags | 2;
  return 3;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "AudioSrc Attn", "", 0.0f, 1.0f, 1.0f, 1.0f, 1.0f, P_AUDIOSRCATTN, "AudioSource distance attenuation");
        RegisterParameter(definition, "Fixed Volume", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_FIXEDVOLUME, "Fixed volume amount");
        RegisterParameter(definition, "Custom Falloff", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_CUSTOMFALLOFF, "Custom volume falloff amount (logarithmic)");
        definition.flags |= UnityAudioEffectDefinitionFlags_IsSpatializer;
        return numparams;
    }